

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall despot::EvalLog::Save(EvalLog *this)

{
  char *pcVar1;
  void *pvVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  int local_220;
  int i;
  undefined1 local_210 [8];
  ofstream fout;
  EvalLog *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar1,_S_out);
  pvVar2 = (void *)std::ostream::operator<<(local_210,start_time);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->runned_instances);
  pvVar2 = (void *)std::ostream::operator<<(local_210,sVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  local_220 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->runned_instances);
    if (sVar3 <= (ulong)(long)local_220) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->runned_instances,(long)local_220);
    poVar5 = std::operator<<((ostream *)local_210,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," ");
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->num_of_completed_runs,(long)local_220);
    pvVar2 = (void *)std::ostream::operator<<(poVar5,*pvVar6);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    local_220 = local_220 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void EvalLog::Save() {
	ofstream fout(log_file_.c_str(), ofstream::out);
	fout << start_time << endl;
	fout << runned_instances.size() << endl;
	for (int i = 0; i < runned_instances.size(); i++)
		fout << runned_instances[i] << " " << num_of_completed_runs[i] << endl;
	fout.close();
}